

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

Vec_Ptr_t *
Abc_NodeBalanceCone(Abc_Obj_t *pNode,Vec_Vec_t *vStorage,int Level,int fDuplicate,int fSelective)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  int local_38;
  int i;
  int RetValue;
  Vec_Ptr_t *vNodes;
  int fSelective_local;
  int fDuplicate_local;
  int Level_local;
  Vec_Vec_t *vStorage_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBalance.c"
                  ,0x137,"Vec_Ptr_t *Abc_NodeBalanceCone(Abc_Obj_t *, Vec_Vec_t *, int, int, int)");
  }
  iVar1 = Vec_VecSize(vStorage);
  if (iVar1 <= Level) {
    Vec_VecPush(vStorage,Level,(void *)0x0);
  }
  p = Vec_VecEntry(vStorage,Level);
  Vec_PtrClear(p);
  iVar1 = Abc_NodeBalanceCone_rec(pNode,p,1,fDuplicate,fSelective);
  if (1 < p->nSize) {
    for (local_38 = 0; local_38 < p->nSize; local_38 = local_38 + 1) {
      pAVar2 = Abc_ObjRegular((Abc_Obj_t *)p->pArray[local_38]);
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffdf;
    }
    if (iVar1 == -1) {
      p->nSize = 0;
    }
    return p;
  }
  __assert_fail("vNodes->nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBalance.c"
                ,0x140,"Vec_Ptr_t *Abc_NodeBalanceCone(Abc_Obj_t *, Vec_Vec_t *, int, int, int)");
}

Assistant:

Vec_Ptr_t * Abc_NodeBalanceCone( Abc_Obj_t * pNode, Vec_Vec_t * vStorage, int Level, int fDuplicate, int fSelective )
{
    Vec_Ptr_t * vNodes;
    int RetValue, i;
    assert( !Abc_ObjIsComplement(pNode) );
    // extend the storage
    if ( Vec_VecSize( vStorage ) <= Level )
        Vec_VecPush( vStorage, Level, 0 );
    // get the temporary array of nodes
    vNodes = Vec_VecEntry( vStorage, Level );
    Vec_PtrClear( vNodes );
    // collect the nodes in the implication supergate
    RetValue = Abc_NodeBalanceCone_rec( pNode, vNodes, 1, fDuplicate, fSelective );
    assert( vNodes->nSize > 1 );
    // unmark the visited nodes
    for ( i = 0; i < vNodes->nSize; i++ )
        Abc_ObjRegular((Abc_Obj_t *)vNodes->pArray[i])->fMarkB = 0;
    // if we found the node and its complement in the same implication supergate, 
    // return empty set of nodes (meaning that we should use constant-0 node)
    if ( RetValue == -1 )
        vNodes->nSize = 0;
    return vNodes;
}